

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O2

void TPZBuildMultiphysicsMesh::TransferFromMeshesT<double>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  double dVar1;
  int iVar2;
  int iVar3;
  TPZFMatrix<double> *pTVar4;
  TPZFMatrix<double> *pTVar5;
  TPZConnect *pTVar6;
  int64_t iVar7;
  TPZSubCompMesh *this;
  long lVar8;
  int64_t iVar9;
  TPZCompEl *pTVar10;
  TPZCompMesh *pTVar11;
  long lVar12;
  int iVar13;
  int r;
  int64_t el;
  int iVar14;
  long lVar15;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_50;
  
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01816478;
  local_50.fStore = (pair<TPZCompMesh_*,_long> *)0x0;
  local_50.fNElements = 0;
  local_50.fNAlloc = 0;
  ComputeAtomicIndexes(MFMesh,&local_50);
  iVar9 = local_50.fNElements;
  pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&MFMesh->fSolution);
  lVar12 = 0;
  if (iVar9 < 1) {
    iVar9 = lVar12;
  }
  do {
    if (lVar12 == iVar9) {
      this = (TPZSubCompMesh *)
             __dynamic_cast(MFMesh,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
      if (this != (TPZSubCompMesh *)0x0) {
        lVar12 = (**(code **)(*(long *)&this->super_TPZCompMesh + 0x98))(this);
        pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                           ((TPZSolutionMatrix *)(lVar12 + 0x370));
        iVar3 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x90))();
        iVar13 = 0;
        if (iVar3 < 1) {
          iVar3 = iVar13;
        }
        for (; iVar13 != iVar3; iVar13 = iVar13 + 1) {
          lVar8 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa0))
                            (&this->super_TPZCompEl,iVar13);
          iVar9 = TPZSubCompMesh::InternalIndex(this,lVar8);
          if (lVar8 == -1) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                       ,0x169);
          }
          TPZSolutionMatrix::operator_cast_to_TPZFMatrix_((TPZSolutionMatrix *)(lVar12 + 0x370));
          pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                             ((TPZChunkVector<TPZConnect,_10> *)(lVar12 + 0x158),lVar8);
          lVar8 = pTVar6->fSequenceNumber;
          lVar15 = (long)(int)lVar8 * 0x10;
          iVar14 = *(int *)(*(long *)(lVar12 + 0x5f0) + 0xc + lVar15);
          pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                             (&(this->super_TPZCompMesh).fSolution);
          pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                             (&(this->super_TPZCompMesh).fConnectVec.
                               super_TPZChunkVector<TPZConnect,_10>,iVar9);
          iVar9 = pTVar6->fSequenceNumber;
          if (lVar8 < 0) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                       ,0x177);
          }
          r = 0;
          if (iVar14 < 1) {
            iVar14 = 0;
            r = 0;
          }
          for (; iVar14 != r; r = r + 1) {
            iVar2 = *(int *)(*(long *)(lVar12 + 0x5f0) + 8 + lVar15);
            iVar7 = TPZBlock::Index(&(this->super_TPZCompMesh).fBlock,iVar9,r);
            pTVar4->fElem[iVar2 + r] = pTVar5->fElem[iVar7];
          }
        }
      }
      lVar12 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
      lVar8 = 0;
      if (lVar12 < 1) {
        lVar12 = lVar8;
      }
      for (; lVar12 != lVar8; lVar8 = lVar8 + 1) {
        pTVar10 = TPZCompMesh::Element(MFMesh,lVar8);
        if ((pTVar10 != (TPZCompEl *)0x0) &&
           (pTVar11 = (TPZCompMesh *)
                      __dynamic_cast(pTVar10,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918),
           pTVar11 != (TPZCompMesh *)0x0)) {
          TransferFromMeshes(cmeshVec,pTVar11);
        }
      }
      TPZVec<std::pair<TPZCompMesh_*,_long>_>::~TPZVec(&local_50);
      return;
    }
    pTVar11 = local_50.fStore[lVar12].first;
    if (pTVar11 != (TPZCompMesh *)0x0) {
      pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar11->fSolution);
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(pTVar11->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                          local_50.fStore[lVar12].second);
      lVar8 = pTVar6->fSequenceNumber;
      if (lVar8 < 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                   ,0x14e);
      }
      iVar3 = (pTVar11->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)lVar8].dim;
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(MFMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar12);
      lVar15 = pTVar6->fSequenceNumber;
      if (lVar15 < 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                   ,0x152);
      }
      iVar13 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
        iVar13 = 0;
      }
      for (; iVar3 != iVar13; iVar13 = iVar13 + 1) {
        iVar7 = TPZBlock::Index(&pTVar11->fBlock,lVar8,iVar13);
        dVar1 = pTVar5->fElem[iVar7];
        iVar7 = TPZBlock::Index(&MFMesh->fBlock,lVar15,iVar13);
        pTVar4->fElem[iVar7] = dVar1;
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMeshesT(TPZVec<TPZCompMesh *> &cmeshVec,
                                                   TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        if(!atomic_mesh) continue;
		TPZBlock &block = atomic_mesh->Block();
        TPZFMatrix<TVar> &sol = atomic_mesh->Solution();
        TPZConnect &con = atomic_mesh->ConnectVec()[indexes[connect].second];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            auto getval = sol(block.Index(seqnum, idf));
            solMF(blockMF.Index(seqnumMF, idf)) = getval;
        }
	}
    
    
    // copy the solution of the submesh to father mesh
    if(1)
    {
        TPZSubCompMesh *msub = dynamic_cast<TPZSubCompMesh*>(MFMesh);
        if(msub){
            TPZCompMesh * fathermesh = msub->FatherMesh();
            //TODOCOMPLEX
            TPZFMatrix<TVar> &fathermeshSol = fathermesh->Solution();
            TPZCompEl *compel = dynamic_cast<TPZCompEl*>(msub);
            int nconnect = compel->NConnects();
            
            for(int ic=0; ic<nconnect ; ic++){
                
                int64_t fatherconIndex = compel->ConnectIndex(ic);
                int64_t submeshIndex = msub->InternalIndex(fatherconIndex);
                if(fatherconIndex == -1) DebugStop();
                //acessing the block on father mesh
                TPZBlock &blockfather = fathermesh->Block();
                TPZFMatrix<TVar> &solfather = fathermesh->Solution();
                
                TPZConnect &confather = fathermesh->ConnectVec()[fatherconIndex];
                int64_t seqnumfather = confather.SequenceNumber();
                int nblock = blockfather.Size(seqnumfather);
                //acessing the block on submesh
                TPZBlock &blocksub = msub->Block();
                TPZFMatrix<TVar> &solsub = ((TPZCompMesh *)(msub))->Solution();
                const TPZConnect &consub = msub->ConnectVec()[submeshIndex];
                const int64_t seqnumsub = consub.SequenceNumber();
                
                if(seqnumfather < 0) DebugStop();
                for(int idf=0 ; idf<nblock; idf++){
                    const int posfather = blockfather.Position(seqnumfather);
                    auto valsub = solsub(blocksub.Index(seqnumsub, idf));
                    fathermeshSol(posfather + idf) = valsub;
                }
            }
            
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMeshes(cmeshVec, sub);
        }
    }
}